

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmState::SnapshotDataType>::Push
          (cmLinkedTree<cmState::SnapshotDataType> *this,iterator it,SnapshotDataType *t)

{
  pointer pcVar1;
  iterator iVar2;
  undefined1 auStack_118 [168];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  size_type sStack_48;
  size_type local_40;
  size_type sStack_38;
  
  memcpy(auStack_118,t,0xa8);
  pcVar1 = (t->EntryPointCommand)._M_dataplus._M_p;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (t->EntryPointCommand)._M_string_length);
  local_50 = t->EntryPointLine;
  sStack_48 = t->IncludeDirectoryPosition;
  local_40 = t->CompileDefinitionsPosition;
  sStack_38 = t->CompileOptionsPosition;
  iVar2 = Push_impl(this,it,(SnapshotDataType *)auStack_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

iterator Push(iterator it, T t)
  {
    return Push_impl(it, t);
  }